

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  vector<diy::Direction,_std::allocator<diy::Direction>_> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffff78;
  BinaryBuffer *in_stack_ffffffffffffff80;
  vector<diy::Direction,_std::allocator<diy::Direction>_> *n;
  Direction *x;
  BinaryBuffer *bb_00;
  value_type *in_stack_ffffffffffffffa0;
  BinaryBuffer in_stack_ffffffffffffffa8;
  vector<diy::Direction,_std::allocator<diy::Direction>_> *in_stack_ffffffffffffffb0;
  Direction *local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bb_00 = (BinaryBuffer *)&stack0xffffffffffffffa8;
  n = in_RSI;
  x = local_18;
  Direction::Direction((Direction *)0x16d319);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::resize
            (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8._vptr_BinaryBuffer,
             in_stack_ffffffffffffffa0);
  Direction::~Direction((Direction *)0x16d339);
  if (local_18 != (Direction *)0x0) {
    std::vector<diy::Direction,_std::allocator<diy::Direction>_>::operator[](in_RSI,0);
    load<diy::Direction>(bb_00,x,(size_t)n);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }